

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O0

void __thiscall QFontCache::decreaseCache(QFontCache *this)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  size_type_conflict sVar7;
  uint *puVar8;
  QFontEngineData **ppQVar9;
  Engine *pEVar10;
  QFontCache *in_RDI;
  long in_FS_OFFSET;
  uint least_popular;
  uint oldest;
  bool cost_decreased;
  uint new_max_cost;
  uint engine_data_cost;
  QFontEngine *fontEngine;
  Iterator jt;
  Iterator end_2;
  Iterator it_3;
  Iterator it_2;
  ConstIterator end_1;
  ConstIterator it_1;
  ConstIterator end;
  ConstIterator it;
  uint in_use_cost;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  QFontEngine *in_stack_fffffffffffffed0;
  Duration in_stack_fffffffffffffed8;
  QFontEngineData *in_stack_fffffffffffffee0;
  const_iterator in_stack_fffffffffffffef8;
  uint local_c4;
  uint local_c0;
  QFontEngine *local_88;
  iterator local_80;
  iterator local_78;
  iterator local_70;
  iterator local_60;
  iterator local_58;
  iterator local_50;
  uint local_34;
  const_iterator local_30;
  const_iterator local_28;
  const_iterator local_20;
  const_iterator local_18;
  uint local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = 0;
  local_18._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
  local_18._M_node =
       (_Base_ptr)
       QMap<QFontDef,_QFontEngineData_*>::constBegin
                 ((QMap<QFontDef,_QFontEngineData_*> *)
                  CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
  local_20._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
  local_20._M_node =
       (_Base_ptr)
       QMap<QFontDef,_QFontEngineData_*>::constEnd
                 ((QMap<QFontDef,_QFontEngineData_*> *)
                  CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
  while (bVar2 = ::operator!=((const_iterator *)in_stack_fffffffffffffed0,
                              (const_iterator *)
                              CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8)), bVar2)
  {
    QMap<QFontDef,_QFontEngineData_*>::const_iterator::value((const_iterator *)0x718044);
    iVar5 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x71804c);
    if (iVar5 != 1) {
      local_c = local_c + 0x568;
    }
    QMap<QFontDef,_QFontEngineData_*>::const_iterator::operator++
              ((const_iterator *)in_stack_fffffffffffffed0);
  }
  local_28._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
  local_28._M_node =
       (_Base_ptr)
       QMultiMap<QFontCache::Key,_QFontCache::Engine>::constBegin
                 ((QMultiMap<QFontCache::Key,_QFontCache::Engine> *)
                  CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
  local_30._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
  local_30._M_node =
       (_Base_ptr)
       QMultiMap<QFontCache::Key,_QFontCache::Engine>::constEnd
                 ((QMultiMap<QFontCache::Key,_QFontCache::Engine> *)
                  CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
  while (bVar2 = ::operator!=((const_iterator *)in_stack_fffffffffffffed0,
                              (const_iterator *)
                              CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8)), bVar2)
  {
    QMultiMap<QFontCache::Key,_QFontCache::Engine>::const_iterator::value
              ((const_iterator *)0x7180ea);
    iVar5 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x7180f6);
    QMultiMap<QFontCache::Key,_QFontCache::Engine>::const_iterator::value
              ((const_iterator *)0x718117);
    iVar6 = QHash<QFontEngine_*,_int>::value
                      ((QHash<QFontEngine_*,_int> *)in_stack_fffffffffffffed8.__r,
                       (QFontEngine **)in_stack_fffffffffffffed0);
    if (iVar6 < iVar5) {
      pEVar10 = QMultiMap<QFontCache::Key,_QFontCache::Engine>::const_iterator::value
                          ((const_iterator *)0x71813b);
      uVar1 = pEVar10->data->cache_cost;
      QMultiMap<QFontCache::Key,_QFontCache::Engine>::const_iterator::value
                ((const_iterator *)0x718166);
      uVar4 = QHash<QFontEngine_*,_int>::value
                        ((QHash<QFontEngine_*,_int> *)in_stack_fffffffffffffed8.__r,
                         (QFontEngine **)in_stack_fffffffffffffed0);
      local_c = uVar1 / uVar4 + local_c;
    }
    QMultiMap<QFontCache::Key,_QFontCache::Engine>::const_iterator::operator++
              ((const_iterator *)in_stack_fffffffffffffed0);
  }
  sVar7 = QMultiMap<QFontCache::Key,_QFontCache::Engine>::size
                    ((QMultiMap<QFontCache::Key,_QFontCache::Engine> *)in_stack_fffffffffffffed0);
  local_c = local_c + (int)sVar7 + 0x200 >> 10;
  local_34 = in_RDI->max_cost >> 1;
  puVar8 = qMax<unsigned_int>(&local_34,&local_c);
  puVar8 = qMax<unsigned_int>(puVar8,&min_cost);
  uVar1 = *puVar8;
  if (((in_RDI->autoClean & 1U) != 0) && (uVar1 == in_RDI->max_cost)) {
    if ((in_RDI->fast & 1U) != 0) {
      bVar2 = QBasicTimer::isActive(&in_RDI->timer);
      if (bVar2) {
        std::chrono::duration<long,std::ratio<1l,1000000000l>>::
        duration<long,std::ratio<60l,1l>,void>
                  ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffed0,
                   (duration<long,_std::ratio<60L,_1L>_> *)
                   CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
        QBasicTimer::start((QBasicTimer *)
                           CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                           in_stack_fffffffffffffed8,(QObject *)0x718295);
        in_RDI->fast = false;
      }
      goto LAB_00718746;
    }
    if ((in_RDI->fast & 1U) == 0) {
      std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
                ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffed0,
                 (duration<long,_std::ratio<1L,_1L>_> *)
                 CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
      QBasicTimer::start((QBasicTimer *)
                         CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                         in_stack_fffffffffffffed8,(QObject *)0x7182e7);
      in_RDI->fast = true;
    }
  }
  in_RDI->max_cost = uVar1;
  local_50._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
  local_50._M_node =
       (_Base_ptr)
       QMap<QFontDef,_QFontEngineData_*>::begin
                 ((QMap<QFontDef,_QFontEngineData_*> *)in_stack_fffffffffffffee0);
  while( true ) {
    local_58._M_node =
         (_Base_ptr)
         QMap<QFontDef,_QFontEngineData_*>::end
                   ((QMap<QFontDef,_QFontEngineData_*> *)in_stack_fffffffffffffee0);
    bVar2 = ::operator!=((iterator *)in_stack_fffffffffffffed0,
                         (iterator *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    if (!bVar2) break;
    QMap<QFontDef,_QFontEngineData_*>::iterator::value((iterator *)0x718366);
    iVar5 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x71836e);
    if (iVar5 == 1) {
      decreaseCost(in_RDI,0x568);
      QMap<QFontDef,_QFontEngineData_*>::iterator::value((iterator *)0x718393);
      QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x71839b);
      ppQVar9 = QMap<QFontDef,_QFontEngineData_*>::iterator::value((iterator *)0x7183a8);
      in_stack_fffffffffffffef8._M_node = (_Base_ptr)*ppQVar9;
      if ((QFontEngineData *)in_stack_fffffffffffffef8._M_node != (QFontEngineData *)0x0) {
        QFontEngineData::~QFontEngineData(in_stack_fffffffffffffee0);
        operator_delete(in_stack_fffffffffffffef8._M_node,0x568);
      }
      QMap<QFontDef,_QFontEngineData_*>::const_iterator::const_iterator
                ((const_iterator *)in_stack_fffffffffffffed0,
                 (iterator *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
      local_60._M_node =
           (_Base_ptr)
           QMap<QFontDef,_QFontEngineData_*>::erase
                     ((QMap<QFontDef,_QFontEngineData_*> *)in_stack_fffffffffffffed8.__r,
                      in_stack_fffffffffffffef8._M_node);
      local_50._M_node = local_60._M_node;
    }
    else {
      QMap<QFontDef,_QFontEngineData_*>::iterator::operator++((iterator *)in_stack_fffffffffffffed0)
      ;
    }
  }
  do {
    bVar2 = false;
    local_70._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
    local_70._M_node =
         (_Base_ptr)
         QMultiMap<QFontCache::Key,_QFontCache::Engine>::begin
                   ((QMultiMap<QFontCache::Key,_QFontCache::Engine> *)in_stack_fffffffffffffee0);
    local_78._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
    local_80._M_node =
         (_Base_ptr)
         QMultiMap<QFontCache::Key,_QFontCache::Engine>::end
                   ((QMultiMap<QFontCache::Key,_QFontCache::Engine> *)in_stack_fffffffffffffee0);
    local_c0 = 0xffffffff;
    local_c4 = 0xffffffff;
    local_78._M_node = local_80._M_node;
    while (bVar3 = ::operator!=((iterator *)in_stack_fffffffffffffed0,
                                (iterator *)
                                CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8)),
          bVar3) {
      QMultiMap<QFontCache::Key,_QFontCache::Engine>::iterator::value((iterator *)0x7184de);
      iVar5 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x7184ea);
      in_stack_fffffffffffffee0 = (QFontEngineData *)&in_RDI->engineCacheCount;
      QMultiMap<QFontCache::Key,_QFontCache::Engine>::iterator::value((iterator *)0x71850b);
      iVar6 = QHash<QFontEngine_*,_int>::value
                        ((QHash<QFontEngine_*,_int> *)in_stack_fffffffffffffed8.__r,
                         (QFontEngine **)in_stack_fffffffffffffed0);
      if (((iVar5 == iVar6) &&
          (pEVar10 = QMultiMap<QFontCache::Key,_QFontCache::Engine>::iterator::value
                               ((iterator *)0x718531), pEVar10->timestamp < local_c0)) &&
         (pEVar10 = QMultiMap<QFontCache::Key,_QFontCache::Engine>::iterator::value
                              ((iterator *)0x718547), pEVar10->hits <= local_c4)) {
        pEVar10 = QMultiMap<QFontCache::Key,_QFontCache::Engine>::iterator::value
                            ((iterator *)0x71855d);
        local_c0 = pEVar10->timestamp;
        pEVar10 = QMultiMap<QFontCache::Key,_QFontCache::Engine>::iterator::value
                            ((iterator *)0x718571);
        local_c4 = pEVar10->hits;
        local_80._M_node = local_70._M_node;
      }
      QMultiMap<QFontCache::Key,_QFontCache::Engine>::iterator::operator++
                ((iterator *)in_stack_fffffffffffffed0);
    }
    local_70._M_node = local_80._M_node;
    bVar3 = ::operator!=((iterator *)in_stack_fffffffffffffed0,
                         (iterator *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    if (bVar3) {
      pEVar10 = QMultiMap<QFontCache::Key,_QFontCache::Engine>::iterator::value
                          ((iterator *)0x7185d7);
      local_88 = pEVar10->data;
      local_70._M_node =
           (_Base_ptr)
           QMultiMap<QFontCache::Key,_QFontCache::Engine>::begin
                     ((QMultiMap<QFontCache::Key,_QFontCache::Engine> *)in_stack_fffffffffffffee0);
      while( true ) {
        QMultiMap<QFontCache::Key,_QFontCache::Engine>::end
                  ((QMultiMap<QFontCache::Key,_QFontCache::Engine> *)in_stack_fffffffffffffee0);
        bVar2 = ::operator!=((iterator *)in_stack_fffffffffffffed0,
                             (iterator *)
                             CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
        if (!bVar2) break;
        pEVar10 = QMultiMap<QFontCache::Key,_QFontCache::Engine>::iterator::value
                            ((iterator *)0x718649);
        if (pEVar10->data == local_88) {
          QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x718667);
          in_stack_fffffffffffffed8.__r = (rep)&in_RDI->engineCache;
          QMultiMap<QFontCache::Key,_QFontCache::Engine>::const_iterator::const_iterator
                    ((const_iterator *)in_stack_fffffffffffffed0,
                     (iterator *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
          local_70._M_node =
               (_Base_ptr)
               QMultiMap<QFontCache::Key,_QFontCache::Engine>::erase
                         ((QMultiMap<QFontCache::Key,_QFontCache::Engine> *)
                          in_stack_fffffffffffffed8.__r,in_stack_fffffffffffffef8._M_node);
        }
        else {
          QMultiMap<QFontCache::Key,_QFontCache::Engine>::iterator::operator++
                    ((iterator *)in_stack_fffffffffffffed0);
        }
      }
      decreaseCost(in_RDI,local_88->cache_cost);
      in_stack_fffffffffffffed0 = local_88;
      if (local_88 != (QFontEngine *)0x0) {
        (*local_88->_vptr_QFontEngine[1])();
      }
      QHash<QFontEngine_*,_int>::remove(&in_RDI->engineCacheCount,(char *)&local_88);
      bVar2 = true;
    }
    in_stack_fffffffffffffecf = false;
    if (bVar2) {
      in_stack_fffffffffffffecf = in_RDI->max_cost < in_RDI->total_cost;
    }
  } while ((bool)in_stack_fffffffffffffecf != false);
LAB_00718746:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFontCache::decreaseCache()
{
    // go through the cache and count up everything in use
    uint in_use_cost = 0;

    {
        FC_DEBUG("  SWEEP engine data:");

        // make sure the cost of each engine data is at least 1kb
        const uint engine_data_cost =
            sizeof(QFontEngineData) > 1024 ? sizeof(QFontEngineData) : 1024;

        EngineDataCache::ConstIterator it = engineDataCache.constBegin(),
                                      end = engineDataCache.constEnd();
        for (; it != end; ++it) {
            FC_DEBUG("    %p: ref %2d", it.value(), int(it.value()->ref.loadRelaxed()));

            if (it.value()->ref.loadRelaxed() != 1)
                in_use_cost += engine_data_cost;
        }
    }

    {
        FC_DEBUG("  SWEEP engine:");

        EngineCache::ConstIterator it = engineCache.constBegin(),
                                  end = engineCache.constEnd();
        for (; it != end; ++it) {
            FC_DEBUG("    %p: timestamp %4u hits %2u ref %2d/%2d, cost %u bytes",
                     it.value().data, it.value().timestamp, it.value().hits,
                     it.value().data->ref.loadRelaxed(), engineCacheCount.value(it.value().data),
                     it.value().data->cache_cost);

            if (it.value().data->ref.loadRelaxed() > engineCacheCount.value(it.value().data))
                in_use_cost += it.value().data->cache_cost / engineCacheCount.value(it.value().data);
        }

        // attempt to make up for rounding errors
        in_use_cost += engineCache.size();
    }

    in_use_cost = (in_use_cost + 512) / 1024; // cost is stored in kb

    /*
      calculate the new maximum cost for the cache

      NOTE: in_use_cost is *not* correct due to rounding errors in the
      above algorithm.  instead of worrying about getting the
      calculation correct, we are more interested in speed, and use
      in_use_cost as a floor for new_max_cost
    */
    uint new_max_cost = qMax(qMax(max_cost / 2, in_use_cost), min_cost);

    FC_DEBUG("  after sweep, in use %u kb, total %u kb, max %u kb, new max %u kb",
              in_use_cost, total_cost, max_cost, new_max_cost);

    if (autoClean) {
        if (new_max_cost == max_cost) {
            if (fast) {
                FC_DEBUG("  cannot shrink cache, slowing timer");

                if (timer.isActive()) {
                    timer.start(slow_timeout, this);
                fast = false;
            }

            return;
        } else if (! fast) {
            FC_DEBUG("  dropping into passing gear");

            timer.start(fast_timeout, this);
            fast = true;        }
        }
    }

    max_cost = new_max_cost;

    {
        FC_DEBUG("  CLEAN engine data:");

        // clean out all unused engine data
        EngineDataCache::Iterator it = engineDataCache.begin();
        while (it != engineDataCache.end()) {
            if (it.value()->ref.loadRelaxed() == 1) {
                FC_DEBUG("    %p", it.value());
                decreaseCost(sizeof(QFontEngineData));
                it.value()->ref.deref();
                delete it.value();
                it = engineDataCache.erase(it);
            } else {
                ++it;
            }
        }
    }

    FC_DEBUG("  CLEAN engine:");

    // clean out the engine cache just enough to get below our new max cost
    bool cost_decreased;
    do {
        cost_decreased = false;

        EngineCache::Iterator it = engineCache.begin(),
                             end = engineCache.end();
        // determine the oldest and least popular of the unused engines
        uint oldest = ~0u;
        uint least_popular = ~0u;

        EngineCache::Iterator jt = end;

        for ( ; it != end; ++it) {
            if (it.value().data->ref.loadRelaxed() != engineCacheCount.value(it.value().data))
                continue;

            if (it.value().timestamp < oldest && it.value().hits <= least_popular) {
                oldest = it.value().timestamp;
                least_popular = it.value().hits;
                jt = it;
            }
        }

        it = jt;
        if (it != end) {
            FC_DEBUG("    %p: timestamp %4u hits %2u ref %2d/%2d, type %d",
                     it.value().data, it.value().timestamp, it.value().hits,
                     it.value().data->ref.loadRelaxed(), engineCacheCount.value(it.value().data),
                     it.value().data->type());

            QFontEngine *fontEngine = it.value().data;
            // get rid of all occurrences
            it = engineCache.begin();
            while (it != engineCache.end()) {
                if (it.value().data == fontEngine) {
                    fontEngine->ref.deref();
                    it = engineCache.erase(it);
                } else {
                    ++it;
                }
            }
            // and delete the last occurrence
            Q_ASSERT(fontEngine->ref.loadRelaxed() == 0);
            decreaseCost(fontEngine->cache_cost);
            delete fontEngine;
            engineCacheCount.remove(fontEngine);

            cost_decreased = true;
        }
    } while (cost_decreased && total_cost > max_cost);
}